

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

PsbtMapDataStruct * __thiscall
cfd::js::api::json::PsbtMapData::ConvertToStruct
          (PsbtMapDataStruct *__return_storage_ptr__,PsbtMapData *this)

{
  PsbtMapData *this_local;
  PsbtMapDataStruct *result;
  
  PsbtMapDataStruct::PsbtMapDataStruct(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&this->key_);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->value,(string *)&this->value_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

PsbtMapDataStruct PsbtMapData::ConvertToStruct() const {  // NOLINT
  PsbtMapDataStruct result;
  result.key = key_;
  result.value = value_;
  result.ignore_items = ignore_items;
  return result;
}